

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

arith_uint256 * __thiscall
arith_uint256::SetCompact(arith_uint256 *this,uint32_t nCompact,bool *pfNegative,bool *pfOverflow)

{
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  base_uint<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = nCompact & 0x7fffff;
  if (nCompact < 0x4000000) {
    uVar2 = uVar2 >> (0x18U - (char)((nCompact >> 0x18) << 3) & 0x1f);
    base_uint<256U>::base_uint(&local_58,(ulong)uVar2);
    base_uint<256U>::operator=(&this->super_base_uint<256U>,&local_58);
  }
  else {
    base_uint<256U>::base_uint(&local_58,(ulong)uVar2);
    base_uint<256U>::operator=(&this->super_base_uint<256U>,&local_58);
    base_uint<256U>::operator<<=(&this->super_base_uint<256U>,(nCompact >> 0x18) * 8 - 0x18);
  }
  if (pfNegative != (bool *)0x0) {
    *pfNegative = (bool)((byte)(nCompact >> 0x17) & uVar2 != 0);
  }
  if (pfOverflow != (bool *)0x0) {
    if (uVar2 == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((nCompact < 0x23000000) && ((nCompact < 0x22000000 || (uVar2 < 0x100)))) {
        bVar1 = 0x20ffffff < nCompact && 0xffff < uVar2;
      }
    }
    *pfOverflow = bVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256& arith_uint256::SetCompact(uint32_t nCompact, bool* pfNegative, bool* pfOverflow)
{
    int nSize = nCompact >> 24;
    uint32_t nWord = nCompact & 0x007fffff;
    if (nSize <= 3) {
        nWord >>= 8 * (3 - nSize);
        *this = nWord;
    } else {
        *this = nWord;
        *this <<= 8 * (nSize - 3);
    }
    if (pfNegative)
        *pfNegative = nWord != 0 && (nCompact & 0x00800000) != 0;
    if (pfOverflow)
        *pfOverflow = nWord != 0 && ((nSize > 34) ||
                                     (nWord > 0xff && nSize > 33) ||
                                     (nWord > 0xffff && nSize > 32));
    return *this;
}